

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeakForAllocationStage
          (MemoryLeakDetectorTable *this,uchar allocation_stage)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorNode *node;
  int i;
  uchar allocation_stage_local;
  MemoryLeakDetectorTable *this_local;
  
  node._0_4_ = 0;
  while( true ) {
    if (0x48 < (int)node) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    pMVar1 = MemoryLeakDetectorList::getFirstLeakForAllocationStage
                       (this->table_ + (int)node,allocation_stage);
    if (pMVar1 != (MemoryLeakDetectorNode *)0x0) break;
    node._0_4_ = (int)node + 1;
  }
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeakForAllocationStage(unsigned char allocation_stage)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}